

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# red_black_tree.hpp
# Opt level: O1

link_type __thiscall
nestl::impl::detail::
rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
::m_create_node<nestl::has_exceptions::exception_ptr_error,int>
          (rb_tree<int,int,nestl::impl::detail::identity<int>,std::less<int>,nestl::test::minimal_allocator<int>>
           *this,exception_ptr_error *err,int *args)

{
  rb_tree_node<int> *prVar1;
  rb_tree_node<int> *prVar2;
  
  prVar1 = test::minimal_allocator<nestl::impl::detail::rb_tree_node<int>_>::
           allocate<nestl::has_exceptions::exception_ptr_error>
                     ((minimal_allocator<nestl::impl::detail::rb_tree_node<int>_> *)this,err,1,
                      (void *)0x0);
  prVar2 = (rb_tree_node<int> *)0x0;
  if ((err->m_exception)._M_exception_object == (void *)0x0) {
    (prVar1->m_storage).m_storage = (storage_type)*args;
    operator_delete((void *)0x0);
    prVar2 = prVar1;
  }
  return prVar2;
}

Assistant:

link_type m_create_node(OperationError& err, Args&&... args) NESTL_NOEXCEPT_SPEC
    {
        node_allocator& node_alloc = m_get_node_allocator();
        link_type l = node_allocator_traits::allocate(err, node_alloc, 1);
        if (err)
        {
            return nullptr;
        }

        nestl::detail::deallocation_scoped_guard<link_type, node_allocator> guard(node_alloc, l, 1);

        l->construct_val(err, std::forward<Args>(args)...);
        if (err)
        {
            return nullptr;
        }

        guard.release();
        return l;
    }